

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O1

Result * CoreML::validateFeatureDescription
                   (Result *__return_storage_ptr__,FeatureDescription *desc,int modelVersion,
                   bool isInput)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint32 uVar5;
  Rep *pRVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  undefined8 *puVar12;
  SequenceFeatureType *pSVar13;
  ArrayFeatureType *pAVar14;
  string *psVar15;
  Type *pTVar16;
  long lVar17;
  ImageFeatureType_ImageSizeRange *pIVar18;
  ImageFeatureType_EnumeratedImageSizes *pIVar19;
  Type *pTVar20;
  ArrayFeatureType_EnumeratedShapes *pAVar21;
  long *plVar22;
  ImageFeatureType *pIVar23;
  undefined8 *puVar24;
  void **ppvVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  FeatureType *pFVar29;
  uint uVar30;
  SizeRange *range;
  SizeRange *pSVar31;
  pointer pcVar32;
  RepeatedPtrFieldBase *pRVar33;
  undefined8 uVar34;
  _Alloc_hider _Var35;
  int iVar36;
  Int64FeatureType *__val;
  uint uVar37;
  RepeatedField<long> *this;
  bool bVar38;
  Result res;
  string __str_2;
  string __str;
  string __str_1;
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  undefined1 local_158 [24];
  undefined1 local_140 [8];
  _Alloc_hider local_138;
  undefined1 local_130 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  RepeatedPtrFieldBase *local_b8;
  Int64FeatureType *local_b0;
  int local_a4;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  FeatureType *local_40;
  ArrayFeatureType_EnumeratedShapes *local_38;
  
  iVar10 = std::__cxx11::string::compare((char *)(desc->name_).ptr_);
  if (iVar10 == 0) {
    local_168 = (undefined1  [8])local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"Feature description must have a non-empty name.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
    local_80.field_2._M_allocated_capacity = local_158._0_8_;
    local_80._M_dataplus._M_p = (pointer)local_168;
    if (local_168 == (undefined1  [8])local_158) {
      return __return_storage_ptr__;
    }
    goto LAB_002766da;
  }
  pFVar29 = desc->type_;
  if (desc == (FeatureDescription *)&Specification::_FeatureDescription_default_instance_ ||
      pFVar29 == (FeatureType *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "Feature description ",(desc->name_).ptr_);
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
    local_168 = (undefined1  [8])local_158;
    puVar24 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_158._0_8_ = *puVar24;
      local_158._8_8_ = puVar12[3];
    }
    else {
      local_158._0_8_ = *puVar24;
      local_168 = (undefined1  [8])*puVar12;
    }
    local_160._M_p = (pointer)puVar12[1];
    *puVar12 = puVar24;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
    goto LAB_002766b0;
  }
  switch(pFVar29->_oneof_case_[0]) {
  case 0:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "Feature description has an unspecified or invalid type for feature \'",
                   (desc->name_).ptr_);
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
    local_168 = (undefined1  [8])local_158;
    puVar24 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_158._0_8_ = *puVar24;
      local_158._8_8_ = puVar12[3];
    }
    else {
      local_158._0_8_ = *puVar24;
      local_168 = (undefined1  [8])*puVar12;
    }
    local_160._M_p = (pointer)puVar12[1];
    *puVar12 = puVar24;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
    break;
  default:
    goto switchD_00276591_caseD_1;
  case 4:
    __val = (Int64FeatureType *)((pFVar29->Type_).imagetype_)->width_;
    if (pFVar29->_oneof_case_[0] == 4) {
      pIVar23 = (pFVar29->Type_).imagetype_;
    }
    else {
      pIVar23 = Specification::ImageFeatureType::default_instance();
    }
    local_b8 = (RepeatedPtrFieldBase *)pIVar23->height_;
    bVar8 = 0 < (long)__val;
    bVar38 = 0 < (long)local_b8;
    pRVar33 = local_b8;
    local_b0 = __val;
    if (2 < modelVersion) {
      if (pFVar29->_oneof_case_[0] == 4) {
        pIVar23 = (pFVar29->Type_).imagetype_;
      }
      else {
        pIVar23 = Specification::ImageFeatureType::default_instance();
      }
      __val = local_b0;
      if (pIVar23->_oneof_case_[0] == 0x1f) {
        if (pFVar29->_oneof_case_[0] == 4) {
          pIVar23 = (pFVar29->Type_).imagetype_;
        }
        else {
          pIVar23 = Specification::ImageFeatureType::default_instance();
        }
        if (pIVar23->_oneof_case_[0] == 0x1f) {
          pIVar18 = (pIVar23->SizeFlexibility_).imagesizerange_;
        }
        else {
          pIVar18 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
        }
        pSVar31 = pIVar18->widthrange_;
        if (pSVar31 == (SizeRange *)0x0) {
          pSVar31 = (SizeRange *)&Specification::_SizeRange_default_instance_;
        }
        validateSizeRange((Result *)local_168,pSVar31);
        bVar9 = Result::good((Result *)local_168);
        if (bVar9) {
          if (pFVar29->_oneof_case_[0] == 4) {
            pIVar23 = (pFVar29->Type_).imagetype_;
          }
          else {
            pIVar23 = Specification::ImageFeatureType::default_instance();
          }
          if (pIVar23->_oneof_case_[0] == 0x1f) {
            pIVar18 = (pIVar23->SizeFlexibility_).imagesizerange_;
          }
          else {
            pIVar18 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
          }
          range = pIVar18->heightrange_;
          if (range == (SizeRange *)0x0) {
            range = (SizeRange *)&Specification::_SizeRange_default_instance_;
          }
          validateSizeRange((Result *)local_140,range);
          local_168 = local_140;
          std::__cxx11::string::operator=((string *)&local_160,(string *)&local_138);
          if (local_138._M_p != local_130 + 8) {
            operator_delete(local_138._M_p,local_130._8_8_ + 1);
          }
          bVar9 = Result::good((Result *)local_168);
          pRVar33 = local_b8;
          if (!bVar9) {
            std::operator+(&local_f8,"Description of image feature \'",(desc->name_).ptr_);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
            pRVar33 = local_b8;
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            puVar24 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_118.field_2._M_allocated_capacity = *puVar24;
              local_118.field_2._8_8_ = puVar12[3];
            }
            else {
              local_118.field_2._M_allocated_capacity = *puVar24;
              local_118._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_118._M_string_length = puVar12[1];
            *puVar12 = puVar24;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            psVar15 = Result::message_abi_cxx11_((Result *)local_168);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_140,&local_118,psVar15);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_140);
            goto LAB_0027806e;
          }
          if (bVar8 && bVar38) {
            if (((long)local_b0 < (long)pSVar31->lowerbound_) ||
               ((-1 < pSVar31->upperbound_ && (pSVar31->upperbound_ < (long)local_b0)))) {
              std::operator+(&local_d8,"Description of image feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              puVar24 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_f8.field_2._M_allocated_capacity = *puVar24;
                local_f8.field_2._8_8_ = puVar12[3];
              }
              else {
                local_f8.field_2._M_allocated_capacity = *puVar24;
                local_f8._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_f8._M_string_length = puVar12[1];
              *puVar12 = puVar24;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              std::__cxx11::to_string(&local_80,(long)local_b0);
              std::operator+(&local_118,&local_f8,&local_80);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
              local_140 = (undefined1  [8])local_130;
              puVar24 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_130._0_8_ = *puVar24;
                local_130._8_8_ = puVar12[3];
              }
              else {
                local_130._0_8_ = *puVar24;
                local_140 = (undefined1  [8])*puVar12;
              }
              local_138._M_p = (pointer)puVar12[1];
              *puVar12 = puVar24;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_140);
            }
            else {
              if ((long)range->lowerbound_ <= (long)local_b8) {
                bVar8 = true;
                if ((range->upperbound_ < 0) || ((long)local_b8 <= range->upperbound_))
                goto LAB_002780c8;
              }
              std::operator+(&local_d8,"Description of image feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              puVar24 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_f8.field_2._M_allocated_capacity = *puVar24;
                local_f8.field_2._8_8_ = puVar12[3];
              }
              else {
                local_f8.field_2._M_allocated_capacity = *puVar24;
                local_f8._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_f8._M_string_length = puVar12[1];
              *puVar12 = puVar24;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              std::__cxx11::to_string(&local_80,(long)pRVar33);
              std::operator+(&local_118,&local_f8,&local_80);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
              local_140 = (undefined1  [8])local_130;
              puVar24 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_130._0_8_ = *puVar24;
                local_130._8_8_ = puVar12[3];
              }
              else {
                local_130._0_8_ = *puVar24;
                local_140 = (undefined1  [8])*puVar12;
              }
              local_138._M_p = (pointer)puVar12[1];
              *puVar12 = puVar24;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_140);
            }
            if (local_140 != (undefined1  [8])local_130) {
              operator_delete((void *)local_140,(ulong)(local_130._0_8_ + 1));
            }
            pRVar33 = local_b8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,
                              (ulong)(local_118.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,
                              (ulong)(local_80.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,
                              (ulong)(local_f8.field_2._M_allocated_capacity + 1));
            }
            uVar34 = local_d8.field_2._M_allocated_capacity;
            _Var35._M_p = local_d8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_002780be;
            goto LAB_002780c6;
          }
          pRVar33 = (RepeatedPtrFieldBase *)range->lowerbound_;
          bVar8 = true;
          local_b0 = (Int64FeatureType *)pSVar31->lowerbound_;
        }
        else {
          std::operator+(&local_f8,"Description of image feature \'",(desc->name_).ptr_);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
          pRVar33 = local_b8;
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          puVar24 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_118.field_2._M_allocated_capacity = *puVar24;
            local_118.field_2._8_8_ = puVar12[3];
          }
          else {
            local_118.field_2._M_allocated_capacity = *puVar24;
            local_118._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_118._M_string_length = puVar12[1];
          *puVar12 = puVar24;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          psVar15 = Result::message_abi_cxx11_((Result *)local_168);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,&local_118,psVar15);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_140);
LAB_0027806e:
          if (local_140 != (undefined1  [8])local_130) {
            operator_delete((void *)local_140,(ulong)(local_130._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,
                            (ulong)(local_118.field_2._M_allocated_capacity + 1));
          }
          uVar34 = local_f8.field_2._M_allocated_capacity;
          _Var35._M_p = local_f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_002780be:
            operator_delete(_Var35._M_p,(ulong)(uVar34 + 1));
          }
LAB_002780c6:
          bVar8 = false;
        }
LAB_002780c8:
        if (local_160._M_p != local_158 + 8) {
          operator_delete(local_160._M_p,(ulong)(local_158._8_8_ + 1));
        }
        __val = local_b0;
        if (!bVar8) {
          return __return_storage_ptr__;
        }
      }
      else {
        pRVar33 = local_b8;
        if (pIVar23->_oneof_case_[0] == 0x15) {
          if (pFVar29->_oneof_case_[0] == 4) {
            pIVar23 = (pFVar29->Type_).imagetype_;
          }
          else {
            pIVar23 = Specification::ImageFeatureType::default_instance();
          }
          if (pIVar23->_oneof_case_[0] == 0x15) {
            pIVar19 = (pIVar23->SizeFlexibility_).enumeratedsizes_;
          }
          else {
            pIVar19 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
          }
          if ((pIVar19->sizes_).super_RepeatedPtrFieldBase.current_size_ == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_140,"Description of image feature \'",(desc->name_).ptr_);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
            local_168 = (undefined1  [8])local_158;
            puVar24 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_158._0_8_ = *puVar24;
              local_158._8_8_ = puVar12[3];
            }
            else {
              local_158._0_8_ = *puVar24;
              local_168 = (undefined1  [8])*puVar12;
            }
            local_160._M_p = (pointer)puVar12[1];
            *puVar12 = puVar24;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
            break;
          }
          if (bVar8 && bVar38) {
            if (pFVar29->_oneof_case_[0] == 4) {
              pIVar23 = (pFVar29->Type_).imagetype_;
            }
            else {
              pIVar23 = Specification::ImageFeatureType::default_instance();
            }
            pRVar33 = local_b8;
            if (pIVar23->_oneof_case_[0] == 0x15) {
              pIVar19 = (pIVar23->SizeFlexibility_).enumeratedsizes_;
            }
            else {
              pIVar19 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
            }
            pRVar6 = (pIVar19->sizes_).super_RepeatedPtrFieldBase.rep_;
            ppvVar25 = pRVar6->elements;
            if (pRVar6 == (Rep *)0x0) {
              ppvVar25 = (void **)0x0;
            }
            lVar17 = (long)(pIVar19->sizes_).super_RepeatedPtrFieldBase.current_size_;
            if (lVar17 != 0) {
              lVar28 = 0;
              bVar8 = false;
              do {
                if (__val == *(Int64FeatureType **)(*(long *)((long)ppvVar25 + lVar28) + 0x10)) {
                  bVar38 = true;
                  bVar9 = true;
                  if (pRVar33 !=
                      *(RepeatedPtrFieldBase **)(*(long *)((long)ppvVar25 + lVar28) + 0x18))
                  goto LAB_00277b92;
                }
                else {
LAB_00277b92:
                  bVar38 = false;
                  bVar9 = bVar8;
                }
              } while ((!bVar38) &&
                      (bVar38 = lVar17 * 8 + -8 != lVar28, lVar28 = lVar28 + 8, bVar8 = bVar9,
                      bVar38));
              if (bVar9) goto LAB_002780f4;
            }
            std::operator+(&local_80,"Description of image feature \'",(desc->name_).ptr_);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            puVar24 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_d8.field_2._M_allocated_capacity = *puVar24;
              local_d8.field_2._8_8_ = puVar12[3];
            }
            else {
              local_d8.field_2._M_allocated_capacity = *puVar24;
              local_d8._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_d8._M_string_length = puVar12[1];
            *puVar12 = puVar24;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            std::__cxx11::to_string(&local_a0,(long)__val);
            std::operator+(&local_f8,&local_d8,&local_a0);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            puVar24 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_118.field_2._M_allocated_capacity = *puVar24;
              local_118.field_2._8_8_ = puVar12[3];
            }
            else {
              local_118.field_2._M_allocated_capacity = *puVar24;
              local_118._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_118._M_string_length = puVar12[1];
            *puVar12 = puVar24;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            std::__cxx11::to_string(&local_60,(long)pRVar33);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_140,&local_118,&local_60);
            puVar12 = (undefined8 *)std::__cxx11::string::append(local_140);
            local_168 = (undefined1  [8])local_158;
            puVar24 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_158._0_8_ = *puVar24;
              local_158._8_8_ = puVar12[3];
            }
            else {
              local_158._0_8_ = *puVar24;
              local_168 = (undefined1  [8])*puVar12;
            }
            local_160._M_p = (pointer)puVar12[1];
            *puVar12 = puVar24;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
            goto LAB_00278afb;
          }
          if (pFVar29->_oneof_case_[0] == 4) {
            pIVar23 = (pFVar29->Type_).imagetype_;
          }
          else {
            pIVar23 = Specification::ImageFeatureType::default_instance();
          }
          if (pIVar23->_oneof_case_[0] == 0x15) {
            pIVar19 = (pIVar23->SizeFlexibility_).enumeratedsizes_;
          }
          else {
            pIVar19 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
          }
          pTVar20 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                              (&(pIVar19->sizes_).super_RepeatedPtrFieldBase,0);
          __val = (Int64FeatureType *)pTVar20->width_;
          if (pFVar29->_oneof_case_[0] == 4) {
            pIVar23 = (pFVar29->Type_).imagetype_;
          }
          else {
            pIVar23 = Specification::ImageFeatureType::default_instance();
          }
          if (pIVar23->_oneof_case_[0] == 0x15) {
            pIVar19 = (pIVar23->SizeFlexibility_).enumeratedsizes_;
          }
          else {
            pIVar19 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
          }
          pTVar20 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                              (&(pIVar19->sizes_).super_RepeatedPtrFieldBase,0);
          pRVar33 = (RepeatedPtrFieldBase *)pTVar20->height_;
        }
      }
    }
LAB_002780f4:
    if ((long)__val < 1) {
      std::operator+(&local_f8,"Description of image feature \'",(desc->name_).ptr_);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      puVar24 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_118.field_2._M_allocated_capacity = *puVar24;
        local_118.field_2._8_8_ = puVar12[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *puVar24;
        local_118._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_118._M_string_length = puVar12[1];
      *puVar12 = puVar24;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      if (pFVar29->_oneof_case_[0] == 4) {
        pIVar23 = (pFVar29->Type_).imagetype_;
      }
      else {
        pIVar23 = Specification::ImageFeatureType::default_instance();
      }
      std::__cxx11::to_string(&local_d8,pIVar23->width_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     &local_118,&local_d8);
      puVar12 = (undefined8 *)std::__cxx11::string::append(local_140);
      local_168 = (undefined1  [8])local_158;
      puVar24 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_158._0_8_ = *puVar24;
        local_158._8_8_ = puVar12[3];
      }
      else {
        local_158._0_8_ = *puVar24;
        local_168 = (undefined1  [8])*puVar12;
      }
      local_160._M_p = (pointer)puVar12[1];
      *puVar12 = puVar24;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
    }
    else {
      if (0 < (long)pRVar33) {
        if (pFVar29->_oneof_case_[0] == 4) {
          pIVar23 = (pFVar29->Type_).imagetype_;
        }
        else {
          pIVar23 = Specification::ImageFeatureType::default_instance();
        }
        if (((uint)pIVar23->colorspace_ < 0x1f) &&
           ((0x40100400U >> (pIVar23->colorspace_ & 0x1fU) & 1) != 0))
        goto switchD_00276591_caseD_1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,"Description of image feature \'",(desc->name_).ptr_);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
        local_168 = (undefined1  [8])local_158;
        puVar24 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_158._0_8_ = *puVar24;
          local_158._8_8_ = puVar12[3];
        }
        else {
          local_158._0_8_ = *puVar24;
          local_168 = (undefined1  [8])*puVar12;
        }
        local_160._M_p = (pointer)puVar12[1];
        *puVar12 = puVar24;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
        break;
      }
      std::operator+(&local_f8,"Description of image feature \'",(desc->name_).ptr_);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      puVar24 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_118.field_2._M_allocated_capacity = *puVar24;
        local_118.field_2._8_8_ = puVar12[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *puVar24;
        local_118._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_118._M_string_length = puVar12[1];
      *puVar12 = puVar24;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      if (pFVar29->_oneof_case_[0] == 4) {
        pIVar23 = (pFVar29->Type_).imagetype_;
      }
      else {
        pIVar23 = Specification::ImageFeatureType::default_instance();
      }
      std::__cxx11::to_string(&local_d8,pIVar23->height_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     &local_118,&local_d8);
      puVar12 = (undefined8 *)std::__cxx11::string::append(local_140);
      local_168 = (undefined1  [8])local_158;
      puVar24 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_158._0_8_ = *puVar24;
        local_158._8_8_ = puVar12[3];
      }
      else {
        local_158._0_8_ = *puVar24;
        local_168 = (undefined1  [8])*puVar12;
      }
      local_160._M_p = (pointer)puVar12[1];
      *puVar12 = puVar24;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
    }
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,(ulong)(local_158._0_8_ + 1));
    }
    if (local_140 != (undefined1  [8])local_130) {
      operator_delete((void *)local_140,(ulong)(local_130._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      (ulong)(local_118.field_2._M_allocated_capacity + 1));
    }
    goto LAB_0027843b;
  case 5:
    local_b0 = (pFVar29->Type_).int64type_;
    if (pFVar29->_oneof_case_[0] == 5) {
      pAVar14 = (ArrayFeatureType *)(pFVar29->Type_).int64type_;
    }
    else {
      pAVar14 = Specification::ArrayFeatureType::default_instance();
    }
    iVar10 = (pAVar14->shape_).current_size_;
    if (2 < modelVersion) {
      if (pFVar29->_oneof_case_[0] == 5) {
        pAVar14 = (pFVar29->Type_).multiarraytype_;
      }
      else {
        pAVar14 = Specification::ArrayFeatureType::default_instance();
      }
      local_b0 = (Int64FeatureType *)&local_b0->_cached_size_;
      if (pAVar14->_oneof_case_[0] != 0x1f) {
        if (pAVar14->_oneof_case_[0] != 0x15) goto LAB_00276905;
        if (pFVar29->_oneof_case_[0] == 5) {
          pAVar14 = (pFVar29->Type_).multiarraytype_;
        }
        else {
          pAVar14 = Specification::ArrayFeatureType::default_instance();
        }
        if (pAVar14->_oneof_case_[0] == 0x15) {
          pAVar21 = (pAVar14->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar21 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
        }
        if ((pAVar21->shapes_).super_RepeatedPtrFieldBase.current_size_ == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"Description of multiarray feature \'",(desc->name_).ptr_);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
          local_168 = (undefined1  [8])local_158;
          puVar24 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_158._0_8_ = *puVar24;
            local_158._8_8_ = puVar12[3];
          }
          else {
            local_158._0_8_ = *puVar24;
            local_168 = (undefined1  [8])*puVar12;
          }
          local_160._M_p = (pointer)puVar12[1];
          *puVar12 = puVar24;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
          break;
        }
        if (pFVar29->_oneof_case_[0] == 5) {
          pAVar14 = (pFVar29->Type_).multiarraytype_;
        }
        else {
          pAVar14 = Specification::ArrayFeatureType::default_instance();
        }
        if (pAVar14->_oneof_case_[0] == 0x15) {
          pAVar21 = (pAVar14->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar21 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
        }
        pRVar6 = (pAVar21->shapes_).super_RepeatedPtrFieldBase.rep_;
        ppvVar25 = pRVar6->elements;
        if (pRVar6 == (Rep *)0x0) {
          ppvVar25 = (void **)0x0;
        }
        lVar17 = (long)(pAVar21->shapes_).super_RepeatedPtrFieldBase.current_size_;
        if (lVar17 != 0) {
          lVar28 = 0;
          do {
            if (*(int *)(*(long *)((long)ppvVar25 + lVar28) + 0x10) == 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_140,"Description of multiarray feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
              local_168 = (undefined1  [8])local_158;
              puVar24 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_158._0_8_ = *puVar24;
                local_158._8_8_ = puVar12[3];
              }
              else {
                local_158._0_8_ = *puVar24;
                local_168 = (undefined1  [8])*puVar12;
              }
              local_160._M_p = (pointer)puVar12[1];
              *puVar12 = puVar24;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
              goto LAB_002766b0;
            }
            lVar28 = lVar28 + 8;
          } while (lVar17 * 8 != lVar28);
        }
        bVar8 = true;
        if (iVar10 != 0) {
          if (pFVar29->_oneof_case_[0] == 5) {
            pAVar14 = (pFVar29->Type_).multiarraytype_;
          }
          else {
            pAVar14 = Specification::ArrayFeatureType::default_instance();
          }
          if (pAVar14->_oneof_case_[0] == 0x15) {
            pAVar21 = (pAVar14->ShapeFlexibility_).enumeratedshapes_;
          }
          else {
            pAVar21 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
          }
          pRVar6 = (pAVar21->shapes_).super_RepeatedPtrFieldBase.rep_;
          ppvVar25 = pRVar6->elements;
          if (pRVar6 == (Rep *)0x0) {
            ppvVar25 = (void **)0x0;
          }
          lVar17 = (long)(pAVar21->shapes_).super_RepeatedPtrFieldBase.current_size_;
          if (lVar17 != 0) {
            pRVar33 = (RepeatedPtrFieldBase *)(ppvVar25 + lVar17);
            bVar38 = false;
            local_b8 = pRVar33;
            local_a4 = iVar10;
            local_40 = pFVar29;
            do {
              iVar36 = 7;
              if (*(int *)((long)*ppvVar25 + 0x10) ==
                  *(int *)&(local_b0->super_MessageLite)._vptr_MessageLite) {
                this = (RepeatedField<long> *)((long)*ppvVar25 + 0x10);
                bVar38 = true;
                if (0 < this->current_size_) {
                  iVar36 = 0;
                  do {
                    plVar22 = google::protobuf::RepeatedField<long>::Get
                                        ((RepeatedField<long> *)local_b0,iVar36);
                    lVar17 = *plVar22;
                    plVar22 = google::protobuf::RepeatedField<long>::Get(this,iVar36);
                    pFVar29 = local_40;
                    pRVar33 = local_b8;
                    iVar10 = local_a4;
                    if (lVar17 != *plVar22) {
                      bVar38 = false;
                      goto LAB_00277f1c;
                    }
                    iVar36 = iVar36 + 1;
                  } while (iVar36 < this->current_size_);
                  bVar38 = true;
                }
LAB_00277f1c:
                iVar36 = 0;
                if (bVar38) {
                  iVar36 = 6;
                }
              }
            } while (((iVar36 == 7) || (iVar36 == 0)) &&
                    (ppvVar25 = ppvVar25 + 1, (RepeatedPtrFieldBase *)ppvVar25 != pRVar33));
            bVar8 = true;
            if (bVar38) goto LAB_00276907;
          }
          std::operator+(&local_118,"Description of multiarray feature \'",(desc->name_).ptr_);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
          puVar24 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_130._0_8_ = *puVar24;
            local_130._8_8_ = puVar12[3];
            local_140 = (undefined1  [8])local_130;
          }
          else {
            local_130._0_8_ = *puVar24;
            local_140 = (undefined1  [8])*puVar12;
          }
          local_138._M_p = (pointer)puVar12[1];
          *puVar12 = puVar24;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append(local_140);
          puVar24 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_158._0_8_ = *puVar24;
            local_158._8_8_ = puVar12[3];
            local_168 = (undefined1  [8])local_158;
          }
          else {
            local_158._0_8_ = *puVar24;
            local_168 = (undefined1  [8])*puVar12;
          }
          local_160._M_p = (pointer)puVar12[1];
          *puVar12 = puVar24;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
          if (local_168 != (undefined1  [8])local_158) {
            operator_delete((void *)local_168,(ulong)(local_158._0_8_ + 1));
          }
          if (local_140 != (undefined1  [8])local_130) {
            operator_delete((void *)local_140,(ulong)(local_130._0_8_ + 1));
          }
          local_80.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
          local_80._M_dataplus._M_p = local_118._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p == &local_118.field_2) {
            return __return_storage_ptr__;
          }
          goto LAB_002766da;
        }
        goto LAB_00276907;
      }
      if (pFVar29->_oneof_case_[0] == 5) {
        pAVar14 = (pFVar29->Type_).multiarraytype_;
      }
      else {
        pAVar14 = Specification::ArrayFeatureType::default_instance();
      }
      if (pAVar14->_oneof_case_[0] == 0x1f) {
        pAVar21 = (pAVar14->ShapeFlexibility_).enumeratedshapes_;
        local_a4 = iVar10;
      }
      else {
        local_a4 = iVar10;
        pAVar21 = (ArrayFeatureType_EnumeratedShapes *)
                  Specification::ArrayFeatureType_ShapeRange::default_instance();
      }
      local_b8 = &(pAVar21->shapes_).super_RepeatedPtrFieldBase;
      if (0 < (pAVar21->shapes_).super_RepeatedPtrFieldBase.current_size_) {
        uVar30 = 0;
        local_38 = pAVar21;
        do {
          pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                              (local_b8,uVar30);
          validateSizeRange((Result *)local_168,pTVar16);
          bVar8 = Result::good((Result *)local_168);
          if (bVar8) {
            if (local_160._M_p != local_158 + 8) {
              operator_delete(local_160._M_p,(ulong)(local_158._8_8_ + 1));
            }
          }
          else {
            std::operator+(&local_80,"Description of multiarray feature \'",(desc->name_).ptr_);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            puVar24 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_d8.field_2._M_allocated_capacity = *puVar24;
              local_d8.field_2._8_8_ = puVar12[3];
            }
            else {
              local_d8.field_2._M_allocated_capacity = *puVar24;
              local_d8._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_d8._M_string_length = puVar12[1];
            *puVar12 = puVar24;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            uVar37 = 1;
            if (9 < uVar30) {
              uVar27 = (ulong)uVar30;
              uVar7 = 4;
              do {
                uVar37 = uVar7;
                uVar11 = (uint)uVar27;
                if (uVar11 < 100) {
                  uVar37 = uVar37 - 2;
                  goto LAB_00276fb8;
                }
                if (uVar11 < 1000) {
                  uVar37 = uVar37 - 1;
                  goto LAB_00276fb8;
                }
                if (uVar11 < 10000) goto LAB_00276fb8;
                uVar27 = uVar27 / 10000;
                uVar7 = uVar37 + 4;
              } while (99999 < uVar11);
              uVar37 = uVar37 + 1;
            }
LAB_00276fb8:
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar37);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_a0._M_dataplus._M_p,uVar37,uVar30)
            ;
            uVar34 = (undefined1 *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              uVar34 = local_d8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar34 <
                (undefined1 *)(local_a0._M_string_length + local_d8._M_string_length)) {
              uVar34 = (undefined1 *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                uVar34 = local_a0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar34 <
                  (undefined1 *)(local_a0._M_string_length + local_d8._M_string_length))
              goto LAB_00277054;
              puVar12 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_a0,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
            }
            else {
LAB_00277054:
              puVar12 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_d8,(ulong)local_a0._M_dataplus._M_p);
            }
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            puVar24 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_f8.field_2._M_allocated_capacity = *puVar24;
              local_f8.field_2._8_8_ = puVar12[3];
            }
            else {
              local_f8.field_2._M_allocated_capacity = *puVar24;
              local_f8._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_f8._M_string_length = puVar12[1];
            *puVar12 = puVar24;
            puVar12[1] = 0;
            *(undefined1 *)puVar24 = 0;
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            puVar24 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_118.field_2._M_allocated_capacity = *puVar24;
              local_118.field_2._8_8_ = puVar12[3];
            }
            else {
              local_118.field_2._M_allocated_capacity = *puVar24;
              local_118._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_118._M_string_length = puVar12[1];
            *puVar12 = puVar24;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            psVar15 = Result::message_abi_cxx11_((Result *)local_168);
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_118,(ulong)(psVar15->_M_dataplus)._M_p);
            local_140 = (undefined1  [8])local_130;
            puVar24 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar24) {
              local_130._0_8_ = *puVar24;
              local_130._8_8_ = puVar12[3];
            }
            else {
              local_130._0_8_ = *puVar24;
              local_140 = (undefined1  [8])*puVar12;
            }
            local_138._M_p = (pointer)puVar12[1];
            *puVar12 = puVar24;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_140);
            if (local_140 != (undefined1  [8])local_130) {
              operator_delete((void *)local_140,(ulong)(local_130._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,
                              (ulong)(local_118.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,
                              (ulong)(local_f8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,
                              (ulong)(local_a0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              (ulong)(local_d8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,
                              (ulong)(local_80.field_2._M_allocated_capacity + 1));
            }
            if (local_160._M_p != local_158 + 8) {
              operator_delete(local_160._M_p,(ulong)(local_158._8_8_ + 1));
            }
            if (!bVar8) {
              return __return_storage_ptr__;
            }
          }
          uVar30 = uVar30 + 1;
          pAVar21 = local_38;
        } while ((int)uVar30 < (local_38->shapes_).super_RepeatedPtrFieldBase.current_size_);
      }
      pRVar33 = local_b8;
      bVar8 = true;
      iVar10 = local_a4;
      if (local_a4 == 0) goto LAB_00276907;
      if (*(int *)&(local_b0->super_MessageLite)._vptr_MessageLite ==
          (pAVar21->shapes_).super_RepeatedPtrFieldBase.current_size_) {
        if (0 < (pAVar21->shapes_).super_RepeatedPtrFieldBase.current_size_) {
          iVar10 = 0;
          local_40 = pFVar29;
          do {
            plVar22 = google::protobuf::RepeatedField<long>::Get
                                ((RepeatedField<long> *)local_b0,iVar10);
            lVar17 = *plVar22;
            pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                (pRVar33,iVar10);
            if (lVar17 < (int)pTVar16->lowerbound_) {
LAB_00277fbc:
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_140,"Description of multiarray feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
              local_168 = (undefined1  [8])local_158;
              puVar24 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar24) {
                local_158._0_8_ = *puVar24;
                local_158._8_8_ = puVar12[3];
              }
              else {
                local_158._0_8_ = *puVar24;
                local_168 = (undefined1  [8])*puVar12;
              }
              local_160._M_p = (pointer)puVar12[1];
              *puVar12 = puVar24;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
              goto LAB_002766b0;
            }
            pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                (pRVar33,iVar10);
            if (-1 < pTVar16->upperbound_) {
              plVar22 = google::protobuf::RepeatedField<long>::Get
                                  ((RepeatedField<long> *)local_b0,iVar10);
              lVar17 = *plVar22;
              pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                  (pRVar33,iVar10);
              if (pTVar16->upperbound_ < lVar17) goto LAB_00277fbc;
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (pAVar21->shapes_).super_RepeatedPtrFieldBase.current_size_);
          bVar8 = true;
          pFVar29 = local_40;
          iVar10 = local_a4;
        }
        goto LAB_00276907;
      }
      std::operator+(&local_80,"Description of multiarray feature \'",(desc->name_).ptr_);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      puVar24 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_d8.field_2._M_allocated_capacity = *puVar24;
        local_d8.field_2._8_8_ = puVar12[3];
      }
      else {
        local_d8.field_2._M_allocated_capacity = *puVar24;
        local_d8._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_d8._M_string_length = puVar12[1];
      *puVar12 = puVar24;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      std::__cxx11::to_string(&local_a0,*(int *)&(local_b0->super_MessageLite)._vptr_MessageLite);
      std::operator+(&local_f8,&local_d8,&local_a0);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      puVar24 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_118.field_2._M_allocated_capacity = *puVar24;
        local_118.field_2._8_8_ = puVar12[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *puVar24;
        local_118._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_118._M_string_length = puVar12[1];
      *puVar12 = puVar24;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      std::__cxx11::to_string(&local_60,(pAVar21->shapes_).super_RepeatedPtrFieldBase.current_size_)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     &local_118,&local_60);
      puVar12 = (undefined8 *)std::__cxx11::string::append(local_140);
      local_168 = (undefined1  [8])local_158;
      puVar24 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_158._0_8_ = *puVar24;
        local_158._8_8_ = puVar12[3];
      }
      else {
        local_158._0_8_ = *puVar24;
        local_168 = (undefined1  [8])*puVar12;
      }
      local_160._M_p = (pointer)puVar12[1];
      *puVar12 = puVar24;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
LAB_00278afb:
      if (local_168 != (undefined1  [8])local_158) {
        operator_delete((void *)local_168,(ulong)(local_158._0_8_ + 1));
      }
      if (local_140 != (undefined1  [8])local_130) {
        operator_delete((void *)local_140,(ulong)(local_130._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        (ulong)(local_60.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        (ulong)(local_118.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        (ulong)(local_a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_00278990;
LAB_002789a0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p == &local_80.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_002766da;
    }
LAB_00276905:
    bVar8 = false;
LAB_00276907:
    if ((isInput && !bVar8) && iVar10 == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "Description of multiarray feature \'",(desc->name_).ptr_);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
      local_168 = (undefined1  [8])local_158;
      puVar24 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar24) {
        local_158._0_8_ = *puVar24;
        local_158._8_8_ = puVar12[3];
      }
      else {
        local_158._0_8_ = *puVar24;
        local_168 = (undefined1  [8])*puVar12;
      }
      local_160._M_p = (pointer)puVar12[1];
      *puVar12 = puVar24;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
    }
    else {
      if (iVar10 != 0) {
        uVar30 = 0;
        while( true ) {
          if (pFVar29->_oneof_case_[0] == 5) {
            pAVar14 = (ArrayFeatureType *)(pFVar29->Type_).int64type_;
          }
          else {
            pAVar14 = Specification::ArrayFeatureType::default_instance();
          }
          if ((pAVar14->shape_).current_size_ <= (int)uVar30) goto LAB_002769c7;
          if (pFVar29->_oneof_case_[0] == 5) {
            pAVar14 = (pFVar29->Type_).multiarraytype_;
          }
          else {
            pAVar14 = Specification::ArrayFeatureType::default_instance();
          }
          plVar22 = google::protobuf::RepeatedField<long>::Get(&pAVar14->shape_,uVar30);
          lVar17 = *plVar22;
          if (lVar17 < 0) break;
          uVar30 = uVar30 + 1;
        }
        std::operator+(&local_80,"Description of multiarray feature \'",(desc->name_).ptr_);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        paVar2 = &local_d8.field_2;
        puVar24 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_d8.field_2._M_allocated_capacity = *puVar24;
          local_d8.field_2._8_8_ = puVar12[3];
          local_d8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *puVar24;
          local_d8._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_d8._M_string_length = puVar12[1];
        *puVar12 = puVar24;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        uVar37 = 1;
        if (9 < uVar30) {
          uVar27 = (ulong)uVar30;
          uVar7 = 4;
          do {
            uVar37 = uVar7;
            uVar11 = (uint)uVar27;
            if (uVar11 < 100) {
              uVar37 = uVar37 - 2;
              goto LAB_002785ce;
            }
            if (uVar11 < 1000) {
              uVar37 = uVar37 - 1;
              goto LAB_002785ce;
            }
            if (uVar11 < 10000) goto LAB_002785ce;
            uVar27 = uVar27 / 10000;
            uVar7 = uVar37 + 4;
          } while (99999 < uVar11);
          uVar37 = uVar37 + 1;
        }
LAB_002785ce:
        paVar3 = &local_a0.field_2;
        local_a0._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar37);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_a0._M_dataplus._M_p,uVar37,uVar30);
        uVar34 = (undefined1 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          uVar34 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar34 < (undefined1 *)(local_a0._M_string_length + local_d8._M_string_length)) {
          uVar34 = (undefined1 *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar3) {
            uVar34 = local_a0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar34 < (undefined1 *)(local_a0._M_string_length + local_d8._M_string_length))
          goto LAB_00278650;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_a0,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
        }
        else {
LAB_00278650:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_d8,(ulong)local_a0._M_dataplus._M_p);
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        puVar24 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_f8.field_2._M_allocated_capacity = *puVar24;
          local_f8.field_2._8_8_ = puVar12[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *puVar24;
          local_f8._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_f8._M_string_length = puVar12[1];
        *puVar12 = puVar24;
        puVar12[1] = 0;
        *(undefined1 *)puVar24 = 0;
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
        paVar1 = &local_118.field_2;
        puVar24 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_118.field_2._M_allocated_capacity = *puVar24;
          local_118.field_2._8_8_ = puVar12[3];
          local_118._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_118.field_2._M_allocated_capacity = *puVar24;
          local_118._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_118._M_string_length = puVar12[1];
        *puVar12 = puVar24;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        uVar27 = -lVar17;
        uVar30 = 1;
        if (9 < uVar27) {
          uVar26 = uVar27;
          uVar37 = 4;
          do {
            uVar30 = uVar37;
            if (uVar26 < 100) {
              uVar30 = uVar30 - 2;
              goto LAB_00278788;
            }
            if (uVar26 < 1000) {
              uVar30 = uVar30 - 1;
              goto LAB_00278788;
            }
            if (uVar26 < 10000) goto LAB_00278788;
            bVar8 = 99999 < uVar26;
            uVar26 = uVar26 / 10000;
            uVar37 = uVar30 + 4;
          } while (bVar8);
          uVar30 = uVar30 + 1;
        }
LAB_00278788:
        paVar4 = &local_60.field_2;
        local_60._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct((ulong)&local_60,(char)uVar30 + '\x01');
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_60._M_dataplus._M_p + 1,uVar30,uVar27);
        uVar34 = (undefined1 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar1) {
          uVar34 = local_118.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar34 < (undefined1 *)(local_60._M_string_length + local_118._M_string_length))
        {
          uVar34 = (undefined1 *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != paVar4) {
            uVar34 = local_60.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar34 < (undefined1 *)(local_60._M_string_length + local_118._M_string_length)
             ) goto LAB_0027880b;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_60,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p);
        }
        else {
LAB_0027880b:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_118,(ulong)local_60._M_dataplus._M_p);
        }
        local_140 = (undefined1  [8])local_130;
        puVar24 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_130._0_8_ = *puVar24;
          local_130._8_8_ = puVar12[3];
        }
        else {
          local_130._0_8_ = *puVar24;
          local_140 = (undefined1  [8])*puVar12;
        }
        local_138._M_p = (pointer)puVar12[1];
        *puVar12 = puVar24;
        puVar12[1] = 0;
        *(undefined1 *)puVar24 = 0;
        puVar12 = (undefined8 *)std::__cxx11::string::append(local_140);
        puVar24 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_158._0_8_ = *puVar24;
          local_158._8_8_ = puVar12[3];
          local_168 = (undefined1  [8])local_158;
        }
        else {
          local_158._0_8_ = *puVar24;
          local_168 = (undefined1  [8])*puVar12;
        }
        local_160._M_p = (pointer)puVar12[1];
        *puVar12 = puVar24;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
        if (local_168 != (undefined1  [8])local_158) {
          operator_delete((void *)local_168,(ulong)(local_158._0_8_ + 1));
        }
        if (local_140 != (undefined1  [8])local_130) {
          operator_delete((void *)local_140,(ulong)(local_130._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar4) {
          operator_delete(local_60._M_dataplus._M_p,
                          (ulong)(local_60.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar1) {
          operator_delete(local_118._M_dataplus._M_p,
                          (ulong)(local_118.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          (ulong)(local_f8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar3) {
          operator_delete(local_a0._M_dataplus._M_p,
                          (ulong)(local_a0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
LAB_00278990:
          operator_delete(local_d8._M_dataplus._M_p,
                          (ulong)(local_d8.field_2._M_allocated_capacity + 1));
        }
        goto LAB_002789a0;
      }
LAB_002769c7:
      if (pFVar29->_oneof_case_[0] == 5) {
        pAVar14 = (pFVar29->Type_).multiarraytype_;
      }
      else {
        pAVar14 = Specification::ArrayFeatureType::default_instance();
      }
      iVar10 = pAVar14->datatype_;
      if (((iVar10 == 0x10020) || (iVar10 == 0x10040)) || (iVar10 == 0x20020)) {
        if (pFVar29->_oneof_case_[0] == 5) {
          pAVar14 = (pFVar29->Type_).multiarraytype_;
        }
        else {
          pAVar14 = Specification::ArrayFeatureType::default_instance();
        }
        uVar5 = pAVar14->_oneof_case_[1];
        if (uVar5 == 0x29) {
          if (pFVar29->_oneof_case_[0] == 5) {
            pAVar14 = (pFVar29->Type_).multiarraytype_;
          }
          else {
            pAVar14 = Specification::ArrayFeatureType::default_instance();
          }
          if (pAVar14->datatype_ == 0x20020) goto switchD_00276591_caseD_1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"Description of multiarray feature \'",(desc->name_).ptr_);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
          local_168 = (undefined1  [8])local_158;
          puVar24 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_158._0_8_ = *puVar24;
            local_158._8_8_ = puVar12[3];
          }
          else {
            local_158._0_8_ = *puVar24;
            local_168 = (undefined1  [8])*puVar12;
          }
          local_160._M_p = (pointer)puVar12[1];
          *puVar12 = puVar24;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
        }
        else if (uVar5 == 0x33) {
          if (pFVar29->_oneof_case_[0] == 5) {
            pAVar14 = (pFVar29->Type_).multiarraytype_;
          }
          else {
            pAVar14 = Specification::ArrayFeatureType::default_instance();
          }
          if (pAVar14->datatype_ == 0x10020) goto switchD_00276591_caseD_1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"Description of multiarray feature \'",(desc->name_).ptr_);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
          local_168 = (undefined1  [8])local_158;
          puVar24 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_158._0_8_ = *puVar24;
            local_158._8_8_ = puVar12[3];
          }
          else {
            local_158._0_8_ = *puVar24;
            local_168 = (undefined1  [8])*puVar12;
          }
          local_160._M_p = (pointer)puVar12[1];
          *puVar12 = puVar24;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
        }
        else {
          if (uVar5 != 0x3d) {
switchD_00276591_caseD_1:
            Result::Result(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          if (pFVar29->_oneof_case_[0] == 5) {
            pAVar14 = (pFVar29->Type_).multiarraytype_;
          }
          else {
            pAVar14 = Specification::ArrayFeatureType::default_instance();
          }
          if (pAVar14->datatype_ == 0x10040) goto switchD_00276591_caseD_1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140,"Description of multiarray feature \'",(desc->name_).ptr_);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
          local_168 = (undefined1  [8])local_158;
          puVar24 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_158._0_8_ = *puVar24;
            local_158._8_8_ = puVar12[3];
          }
          else {
            local_158._0_8_ = *puVar24;
            local_168 = (undefined1  [8])*puVar12;
          }
          local_160._M_p = (pointer)puVar12[1];
          *puVar12 = puVar24;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,"Description of multiarray feature \'",(desc->name_).ptr_);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
        local_168 = (undefined1  [8])local_158;
        puVar24 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_158._0_8_ = *puVar24;
          local_158._8_8_ = puVar12[3];
        }
        else {
          local_158._0_8_ = *puVar24;
          local_168 = (undefined1  [8])*puVar12;
        }
        local_160._M_p = (pointer)puVar12[1];
        *puVar12 = puVar24;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
      }
    }
    break;
  case 6:
    if (*(int *)((long)&(((pFVar29->Type_).multiarraytype_)->shape_).rep_ + 4) != 0)
    goto switchD_00276591_caseD_1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "Description of dictionary feature \'",(desc->name_).ptr_);
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_140);
    local_168 = (undefined1  [8])local_158;
    puVar24 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_158._0_8_ = *puVar24;
      local_158._8_8_ = puVar12[3];
    }
    else {
      local_158._0_8_ = *puVar24;
      local_168 = (undefined1  [8])*puVar12;
    }
    local_160._M_p = (pointer)puVar12[1];
    *puVar12 = puVar24;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
    break;
  case 7:
    if (2 < modelVersion) {
      if (pFVar29->_oneof_case_[0] == 7) {
        pSVar13 = (pFVar29->Type_).sequencetype_;
      }
      else {
        pSVar13 = Specification::SequenceFeatureType::default_instance();
      }
      pSVar31 = pSVar13->sizerange_;
      if (pSVar31 == (SizeRange *)0x0) {
        pSVar31 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      validateSizeRange((Result *)local_168,pSVar31);
      bVar8 = Result::good((Result *)local_168);
      if (bVar8) {
        if (pFVar29->_oneof_case_[0] == 7) {
          pAVar14 = (pFVar29->Type_).multiarraytype_;
        }
        else {
          pAVar14 = (ArrayFeatureType *)Specification::SequenceFeatureType::default_instance();
        }
        if (pAVar14->datatype_ != 0) {
          if (local_160._M_p != local_158 + 8) {
            operator_delete(local_160._M_p,(ulong)(local_158._8_8_ + 1));
          }
          goto switchD_00276591_caseD_1;
        }
        std::operator+(&local_118,"Description of sequence feature \'",(desc->name_).ptr_);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
        puVar24 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_130._0_8_ = *puVar24;
          local_130._8_8_ = puVar12[3];
          local_140 = (undefined1  [8])local_130;
        }
        else {
          local_130._0_8_ = *puVar24;
          local_140 = (undefined1  [8])*puVar12;
        }
        local_138._M_p = (pointer)puVar12[1];
        *puVar12 = puVar24;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_140);
        if (local_140 != (undefined1  [8])local_130) {
          operator_delete((void *)local_140,(ulong)(local_130._0_8_ + 1));
        }
        uVar34 = local_118.field_2._M_allocated_capacity;
        _Var35._M_p = local_118._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_00277a55;
      }
      else {
        std::operator+(&local_f8,"Description of sequence feature \'",(desc->name_).ptr_);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
        puVar24 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_118.field_2._M_allocated_capacity = *puVar24;
          local_118.field_2._8_8_ = puVar12[3];
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = *puVar24;
          local_118._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_118._M_string_length = puVar12[1];
        *puVar12 = puVar24;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        psVar15 = Result::message_abi_cxx11_((Result *)local_168);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,&local_118,psVar15);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_140);
        if (local_140 != (undefined1  [8])local_130) {
          operator_delete((void *)local_140,(ulong)(local_130._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          (ulong)(local_118.field_2._M_allocated_capacity + 1));
        }
        uVar34 = local_f8.field_2._M_allocated_capacity;
        _Var35._M_p = local_f8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_00277a55:
          operator_delete(_Var35._M_p,(ulong)(uVar34 + 1));
        }
      }
      local_80.field_2._M_allocated_capacity = local_158._8_8_;
      local_80._M_dataplus._M_p = local_160._M_p;
      if (local_160._M_p == local_158 + 8) {
        return __return_storage_ptr__;
      }
      goto LAB_002766da;
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_f8,'\x01');
    *local_f8._M_dataplus._M_p = '3';
    puVar12 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x321732);
    puVar24 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_118.field_2._M_allocated_capacity = *puVar24;
      local_118.field_2._8_8_ = puVar12[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *puVar24;
      local_118._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_118._M_string_length = puVar12[1];
    *puVar12 = puVar24;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    puVar24 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_130._0_8_ = *puVar24;
      local_130._8_8_ = puVar12[3];
      local_140 = (undefined1  [8])local_130;
    }
    else {
      local_130._0_8_ = *puVar24;
      local_140 = (undefined1  [8])*puVar12;
    }
    local_138._M_p = (pointer)puVar12[1];
    *puVar12 = puVar24;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    uVar30 = -modelVersion;
    if (0 < modelVersion) {
      uVar30 = modelVersion;
    }
    uVar37 = 1;
    if (9 < uVar30) {
      uVar27 = (ulong)uVar30;
      uVar7 = 4;
      do {
        uVar37 = uVar7;
        uVar11 = (uint)uVar27;
        if (uVar11 < 100) {
          uVar37 = uVar37 - 2;
          goto LAB_002774d0;
        }
        if (uVar11 < 1000) {
          uVar37 = uVar37 - 1;
          goto LAB_002774d0;
        }
        if (uVar11 < 10000) goto LAB_002774d0;
        uVar27 = uVar27 / 10000;
        uVar7 = uVar37 + 4;
      } while (99999 < uVar11);
      uVar37 = uVar37 + 1;
    }
LAB_002774d0:
    paVar2 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar37 - (char)(modelVersion >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_d8._M_dataplus._M_p + ((uint)modelVersion >> 0x1f),uVar37,uVar30);
    pcVar32 = (pointer)0xf;
    if (local_140 != (undefined1  [8])local_130) {
      pcVar32 = (pointer)local_130._0_8_;
    }
    if (pcVar32 < local_138._M_p + local_d8._M_string_length) {
      uVar34 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) {
        uVar34 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar34 < local_138._M_p + local_d8._M_string_length) goto LAB_00277552;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_140);
    }
    else {
LAB_00277552:
      puVar12 = (undefined8 *)
                std::__cxx11::string::_M_append(local_140,(ulong)local_d8._M_dataplus._M_p);
    }
    local_168 = (undefined1  [8])local_158;
    puVar24 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_158._0_8_ = *puVar24;
      local_158._8_8_ = puVar12[3];
    }
    else {
      local_158._0_8_ = *puVar24;
      local_168 = (undefined1  [8])*puVar12;
    }
    local_160._M_p = (pointer)puVar12[1];
    *puVar12 = puVar24;
    puVar12[1] = 0;
    *(undefined1 *)puVar24 = 0;
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_168);
    if (local_168 != (undefined1  [8])local_158) {
      operator_delete((void *)local_168,(ulong)(local_158._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1))
      ;
    }
    if (local_140 != (undefined1  [8])local_130) {
      operator_delete((void *)local_140,(ulong)(local_130._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      (ulong)(local_118.field_2._M_allocated_capacity + 1));
    }
LAB_0027843b:
    local_80.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
    local_80._M_dataplus._M_p = local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_002766da;
  }
LAB_002766b0:
  if (local_168 != (undefined1  [8])local_158) {
    operator_delete((void *)local_168,(ulong)(local_158._0_8_ + 1));
  }
  local_80.field_2._M_allocated_capacity = local_130._0_8_;
  local_80._M_dataplus._M_p = (pointer)local_140;
  if (local_140 != (undefined1  [8])local_130) {
LAB_002766da:
    operator_delete(local_80._M_dataplus._M_p,(ulong)(local_80.field_2._M_allocated_capacity + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateFeatureDescription(const Specification::FeatureDescription& desc, int modelVersion, bool isInput) {
        if (desc.name() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description must have a non-empty name.");
        }

        if (!desc.has_type()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description " + desc.name() + " must specify a valid feature type.");
        }

        const auto& type = desc.type();
        switch (type.Type_case()) {
            case Specification::FeatureType::kDoubleType:
            case Specification::FeatureType::kInt64Type:
            case Specification::FeatureType::kStringType:
                // in general, non-parametric types need no further validation
                break;

            case Specification::FeatureType::kMultiArrayType:
            {
                const auto &defaultShape = type.multiarraytype().shape();
                bool hasExplicitDefault = (type.multiarraytype().shape_size() != 0);
                bool hasImplictDefault = false;
                // Newer versions use the updated shape constraints for images and multi-arrays
                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.multiarraytype().ShapeFlexibility_case()) {

                        case Specification::ArrayFeatureType::kEnumeratedShapes: {

                            hasImplictDefault = true;

                            if (type.multiarraytype().enumeratedshapes().shapes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() == 0) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() + "' has enumerated shapes with zero dimensions.");
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() != defaultShape.size()) { continue; }
                                foundDefault = true;
                                for (int d = 0; d < shape.shape_size(); d++) {
                                    if (defaultShape[d] != shape.shape(d)) { foundDefault = false; break; }
                                }
                                if (foundDefault) { break; }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has a default shape specified " +
                                              " which is not within the allowed enumerated shapes specified.");
                            }

                            break;
                        }
                        case Specification::ArrayFeatureType::kShapeRange: {

                            hasImplictDefault = true;

                            const auto& sizeRanges = type.multiarraytype().shaperange().sizeranges();
                            for (int i = 0; i < sizeRanges.size(); i++) {
                                const auto &range = sizeRanges[i];
                                Result res = validateSizeRange(range);
                                if (!res.good()) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() +
                                                  "' has an invalid range for dimension " + std::to_string(i) + ". " +
                                                  res.message());
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            // Check if default is compatible
                            if (defaultShape.size() != sizeRanges.size()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() +
                                              "' has a default " + std::to_string(defaultShape.size()) + "-d shape but a " +
                                              std::to_string(sizeRanges.size()) + "-d shape range");
                            }

                             for (int i = 0; i < sizeRanges.size(); i++) {
                                 if (defaultShape[i] < (int)sizeRanges[i].lowerbound() ||
                                     (sizeRanges[i].upperbound() >= 0 && defaultShape[i] > sizeRanges[i].upperbound())) {

                                     return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                   "Description of multiarray feature '" + desc.name() +
                                                   "' has a default shape that is out of the specified shape range");
                                 }
                             }

                            break;
                        }
                        case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                            break;
                    }

                }

                if (isInput && !hasExplicitDefault && !hasImplictDefault) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of multiarray feature '" + desc.name() + "' has missing shape constraints.");
                }

                if (hasExplicitDefault) {
                    for (int i=0; i < type.multiarraytype().shape_size(); i++) {
                        const auto &value = type.multiarraytype().shape(i);
                        if (value < 0) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has an invalid shape. "
                                          "Element " + std::to_string(i) + " has non-positive value " + std::to_string(value) + ".");
                        }
                    }
                }

                switch (type.multiarraytype().datatype()) {
                    case Specification::ArrayFeatureType_ArrayDataType_DOUBLE:
                    case Specification::ArrayFeatureType_ArrayDataType_FLOAT32:
                    case Specification::ArrayFeatureType_ArrayDataType_INT32:
                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of multiarray feature '" + desc.name() + "' has an invalid or unspecified dataType. "
                                      "It must be specified as DOUBLE, FLOAT32 or INT32");
                }

                switch (type.multiarraytype().defaultOptionalValue_case()) {
                    case CoreML::Specification::ArrayFeatureType::kDoubleDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_DOUBLE){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kFloatDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kIntDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_INT32){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    default:
                        break;
                }
                
                break;

            }
            case Specification::FeatureType::kDictionaryType:
                switch (type.dictionarytype().KeyType_case()) {
                    case Specification::DictionaryFeatureType::KeyTypeCase::kInt64KeyType:
                    case Specification::DictionaryFeatureType::KeyTypeCase::kStringKeyType:
                        break;
                    case Specification::DictionaryFeatureType::KeyTypeCase::KEYTYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of dictionary feature '" + desc.name() + "' must contain a key type of either Int64 or String.");
                }
                break;

            case Specification::FeatureType::kImageType: {

                int64_t defaultWidth = type.imagetype().width();
                int64_t defaultHeight = type.imagetype().height();
                bool hasDefault = (defaultWidth > 0 && defaultHeight > 0);

                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.imagetype().SizeFlexibility_case()) {

                        case Specification::ImageFeatureType::kEnumeratedSizes: {

                            if (type.imagetype().enumeratedsizes().sizes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)type.imagetype().enumeratedsizes().sizes(0).width();
                                defaultHeight = (int64_t)type.imagetype().enumeratedsizes().sizes(0).height();
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &size : type.imagetype().enumeratedsizes().sizes()) {
                                if (defaultWidth == (int64_t)size.width() && defaultHeight == (int64_t)size.height()) {
                                    foundDefault = true;
                                    break;
                                }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has a default size of " +
                                              std::to_string(defaultWidth) + " × " + std::to_string(defaultHeight) +
                                              " which is not within the allowed enumerated sizes specified.");
                            }

                            break;
                        }
                        case Specification::ImageFeatureType::kImageSizeRange:
                        {
                            const auto& widthRange = type.imagetype().imagesizerange().widthrange();
                            Result res = validateSizeRange(widthRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible width range. "
                                               + res.message());
                            }

                            const auto& heightRange = type.imagetype().imagesizerange().heightrange();
                            res = validateSizeRange(heightRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible height range. "
                                              + res.message());
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)widthRange.lowerbound();
                                defaultHeight = (int64_t)heightRange.lowerbound();
                                break;
                            }

                            if (defaultWidth < (int64_t)widthRange.lowerbound() ||
                                (widthRange.upperbound() >=0 && defaultWidth > widthRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default width "
                                              + std::to_string(defaultWidth) + " is not within specified flexible width range");
                            }

                            if (defaultHeight < (int64_t)heightRange.lowerbound() ||
                                (heightRange.upperbound() >=0 && defaultHeight > heightRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default height "
                                              + std::to_string(defaultHeight) + " is not within specified flexible height range");
                            }


                            break;
                        }
                        default:
                            break;
                    }

                }

                if (defaultWidth <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive width " + std::to_string(type.imagetype().width()) + ".");
                }

                if (defaultHeight <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive height " + std::to_string(type.imagetype().height()) + ".");
                }

                switch (type.imagetype().colorspace()) {
                    case Specification::ImageFeatureType_ColorSpace_GRAYSCALE:
                    case Specification::ImageFeatureType_ColorSpace_RGB:
                    case Specification::ImageFeatureType_ColorSpace_BGR:
                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of image feature '" + desc.name() +
                                      "' has missing or invalid colorspace. It must be RGB, BGR or GRAYSCALE.");
                }
                break;
            }
            case Specification::FeatureType::kSequenceType: {

                if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS12) {
                    return  Result(ResultType::INVALID_MODEL_INTERFACE,
                                   "Sequence types are only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS12)+
                                   ". This model has version " + std::to_string(modelVersion));
                }

                // Validate size
                Result res = validateSizeRange(type.sequencetype().sizerange());
                if (!res.good()) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of sequence feature '" + desc.name() + "' has invalid allowed sizes. "
                                  + res.message());
                }

                // Validate type

                switch (type.sequencetype().Type_case()) {
                    case Specification::SequenceFeatureType::kInt64Type:
                    case Specification::SequenceFeatureType::kStringType:
                        break;
                    case Specification::SequenceFeatureType::TYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of sequence feature '" + desc.name() + "' has invalid or missing type. "
                                      "Only Int64 and String sequences are currently supported");


                }
                break;
            }
            case Specification::FeatureType::TYPE_NOT_SET:
                // these aren't equal to anything, even themselves
                return Result(ResultType::INVALID_MODEL_INTERFACE,
                              "Feature description has an unspecified or invalid type for feature '" + desc.name() + "'.");
        }

        // If we got here, the feature description is valid.
        return Result();
    }